

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadPlaMo.c
# Opt level: O2

int Mop_ManRemoveIdentical(Mop_Man_t *p,Vec_Int_t *vGroup)

{
  int i;
  int i_00;
  int iVar1;
  word *__s1;
  word *pwVar2;
  word *pwVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  int i_01;
  int i_02;
  
  iVar6 = 0;
  for (i_02 = 0; i_02 < vGroup->nSize; i_02 = i_02 + 1) {
    i = Vec_IntEntry(vGroup,i_02);
    if (i != -1) {
      __s1 = Mop_ManCubeIn(p,i);
      i_01 = i_02;
      while (i_01 = i_01 + 1, i_01 < vGroup->nSize) {
        i_00 = Vec_IntEntry(vGroup,i_01);
        if (i_00 != -1) {
          pwVar2 = Mop_ManCubeIn(p,i_00);
          iVar1 = bcmp(__s1,pwVar2,(long)p->nWordsIn << 3);
          if (iVar1 == 0) {
            pwVar2 = Mop_ManCubeOut(p,i);
            pwVar3 = Mop_ManCubeOut(p,i_00);
            uVar4 = (ulong)(uint)p->nWordsOut;
            if (p->nWordsOut < 1) {
              uVar4 = 0;
            }
            for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
              pwVar2[uVar5] = pwVar2[uVar5] | pwVar3[uVar5];
            }
            Vec_IntWriteEntry(vGroup,i_01,-1);
            Vec_IntPush(p->vFree,i_00);
            iVar6 = iVar6 + 1;
          }
        }
      }
    }
  }
  if (iVar6 != 0) {
    Map_ManGroupCompact(vGroup);
  }
  return iVar6;
}

Assistant:

int Mop_ManRemoveIdentical( Mop_Man_t * p, Vec_Int_t * vGroup )
{
    int w, c1, c2, iCube1, iCube2, nEqual = 0;
    Vec_IntForEachEntry( vGroup, iCube1, c1 )
    if ( iCube1 != -1 )
    {
        word * pCube1Out, * pCube1 = Mop_ManCubeIn( p, iCube1 );
        Vec_IntForEachEntryStart( vGroup, iCube2, c2, c1+1 )
        if ( iCube2 != -1 )
        {
            word * pCube2Out, * pCube2 = Mop_ManCubeIn( p, iCube2 );
            if ( memcmp(pCube1, pCube2, sizeof(word)*p->nWordsIn) )
                continue;
            // merge cubes
            pCube1Out = Mop_ManCubeOut( p, iCube1 );
            pCube2Out = Mop_ManCubeOut( p, iCube2 );
            for ( w = 0; w < p->nWordsOut; w++ )
                pCube1Out[w] |= pCube2Out[w];
            Vec_IntWriteEntry( vGroup, c2, -1 );
            Vec_IntPush( p->vFree, iCube2 );
            nEqual++;
        }
    }
    if ( nEqual )
        Map_ManGroupCompact( vGroup );
    return nEqual;
}